

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O1

shared_ptr<const_mathiu::impl::Expr> __thiscall
mathiu::impl::mergeSum<mathiu::impl::Sum>(impl *this,Sum *c1,Sum *c2)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  undefined8 *puVar3;
  size_t *psVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_mathiu::impl::Expr> sVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_60;
  
  local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  local_68->_M_use_count = 1;
  local_68->_M_weak_count = 1;
  local_68->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
  local_70 = local_68 + 1;
  *(undefined4 *)&local_68[1]._vptr__Sp_counted_base = 0;
  *(undefined1 *)&local_68[4]._M_use_count = 0;
  merge<mathiu::impl::Sum,mathiu::impl::mergeSum<mathiu::impl::Sum>(mathiu::impl::Sum_const&,mathiu::impl::Sum_const&)::_lambda(auto:1&&,auto:2&&)_1_,std::shared_ptr<mathiu::impl::Expr_const>>
            (&local_60,(impl *)c1,c2,&local_70);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_60._M_impl.super__Rb_tree_header._M_node_count == 1) {
    *(_Base_ptr *)this = local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_left;
    p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_right;
    *(_Base_ptr *)(this + 8) = p_Var2;
    if (p_Var2 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
      }
    }
  }
  else {
    *(undefined8 *)this = 0;
    puVar3 = (undefined8 *)operator_new(0x50);
    puVar3[1] = 0x100000001;
    *puVar3 = &PTR___Sp_counted_ptr_inplace_00253718;
    p_Var2 = (_Base_ptr)(puVar3 + 3);
    if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      *(undefined4 *)(puVar3 + 3) = 0;
      puVar3[4] = 0;
      puVar3[5] = p_Var2;
      puVar3[6] = p_Var2;
      psVar4 = puVar3 + 7;
    }
    else {
      p_Var1 = &local_60._M_impl.super__Rb_tree_header;
      *(_Rb_tree_color *)(puVar3 + 3) = local_60._M_impl.super__Rb_tree_header._M_header._M_color;
      puVar3[4] = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      puVar3[5] = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      puVar3[6] = local_60._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var2;
      psVar4 = &local_60._M_impl.super__Rb_tree_header._M_node_count;
      puVar3[7] = local_60._M_impl.super__Rb_tree_header._M_node_count;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    *psVar4 = 0;
    *(undefined1 *)(puVar3 + 9) = 7;
    *(undefined8 **)(this + 8) = puVar3;
    *(undefined8 **)this = puVar3 + 2;
  }
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  ::~_Rb_tree(&local_60);
  sVar5.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_mathiu::impl::Expr>)
         sVar5.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto mergeSum(C const &c1, C const &c2)
    {
        constexpr auto add = [](auto &&lhs, auto &&rhs)
        { return lhs + rhs; };
        auto result = merge(c1, c2, add, 0_i);
        ;
        if (result.size() == 1)
        {
            return (*result.begin()).second;
        }
        return makeSharedExprPtr(std::move(result));
    }